

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O1

void mpz_sub(__mpz_struct *r,__mpz_struct *a,__mpz_struct *b)

{
  int iVar1;
  int iVar3;
  mp_size_t mVar2;
  
  if ((b->_mp_size ^ a->_mp_size) < 0) {
    mVar2 = mpz_abs_add(r,a,b);
    iVar1 = (int)mVar2;
  }
  else {
    mVar2 = mpz_abs_sub(r,a,b);
    iVar1 = (int)mVar2;
  }
  iVar3 = -iVar1;
  if (-1 < a->_mp_size) {
    iVar3 = iVar1;
  }
  r->_mp_size = iVar3;
  return;
}

Assistant:

void
mpz_sub (mpz_t r, const mpz_t a, const mpz_t b)
{
  mp_size_t rn;

  if ( (a->_mp_size ^ b->_mp_size) >= 0)
    rn = mpz_abs_sub (r, a, b);
  else
    rn = mpz_abs_add (r, a, b);

  r->_mp_size = a->_mp_size >= 0 ? rn : - rn;
}